

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

bool __thiscall RowSampler::sample(RowSampler *this)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = true;
  if (this->_step != 1) {
    uVar1 = this->_count + 1;
    this->_count = uVar1;
    if (uVar1 == this->_next) {
      this->_sampled = this->_sampled + 1;
      iVar2 = 1;
      if (this->_mode == RANDOM) {
        uVar1 = rand();
        iVar2 = uVar1 % this->_step + 1;
      }
      this->_next = this->_step * this->_sampled + iVar2;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool
    sample()
    {
        // Don't bother if samling every row
        if (this->_step == 1) return true;

        // Bump row counter
        this->_count++;

        // Check if this row is sampled
        if (this->_count == this->_next)
        {
            // Bump sampled counter
            this->_sampled++;

            // If yes, determine next row in this sampling bin to sample
            unsigned int row = 1;
            if (this->_mode == SamplerOptions::RANDOM)
            {
                row = 1 + (unsigned int)(rand() % this->_step);
            }
            this->_next = this->_sampled * this->_step + row;

            return true;
        }

        return false;

    }